

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_relax_snode.c
# Opt level: O2

void ilu_relax_snode(int n,int *et,int relax_columns,int *descendants,int *relax_end,
                    int *relax_fsupc)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  ifill(relax_end,n,-1);
  ifill(relax_fsupc,n,-1);
  uVar4 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    descendants[uVar4] = 0;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar6 = et[uVar4];
    if (iVar6 != n) {
      descendants[iVar6] = descendants[uVar4] + descendants[iVar6] + 1;
    }
  }
  lVar5 = 0;
  iVar6 = 0;
  do {
    if (n <= iVar6) {
      return;
    }
    lVar7 = (long)iVar6;
    iVar1 = iVar6;
    do {
      iVar2 = iVar1;
      iVar1 = et[lVar7];
      if (iVar1 == n) break;
      lVar7 = (long)iVar1;
    } while (descendants[lVar7] < relax_columns);
    relax_end[iVar6] = iVar2;
    relax_fsupc[lVar5] = iVar6;
    lVar7 = (long)iVar2;
    iVar6 = iVar2;
    do {
      lVar7 = lVar7 + 1;
      iVar6 = iVar6 + 1;
      if (descendants[lVar7] == 0) break;
    } while (lVar7 < n);
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void
ilu_relax_snode (
	      const	int n,
	      const int	*et,	       /* column elimination tree */
	      const int relax_columns, /* max no of columns allowed in a
					  relaxed snode */
	      int	*descendants,  /* no of descendants of each node
					 in the etree */
	      int	*relax_end,    /* last column in a supernode
					* if j-th column starts a relaxed
					* supernode, relax_end[j] represents
					* the last column of this supernode */
	      int	*relax_fsupc   /* first column in a supernode
					* relax_fsupc[j] represents the first
					* column of j-th supernode */
	     )
{

    register int j, f, parent;
    register int snode_start;	/* beginning of a snode */

    ifill (relax_end, n, SLU_EMPTY);
    ifill (relax_fsupc, n, SLU_EMPTY);
    for (j = 0; j < n; j++) descendants[j] = 0;

    /* Compute the number of descendants of each node in the etree */
    for (j = 0; j < n; j++) {
	parent = et[j];
	if ( parent != n )  /* not the dummy root */
	    descendants[parent] += descendants[j] + 1;
    }

    /* Identify the relaxed supernodes by postorder traversal of the etree. */
    for (j = f = 0; j < n; ) {
	parent = et[j];
	snode_start = j;
	while ( parent != n && descendants[parent] < relax_columns ) {
	    j = parent;
	    parent = et[j];
	}
	/* Found a supernode with j being the last column. */
	relax_end[snode_start] = j;		/* Last column is recorded */
	j++;
	relax_fsupc[f++] = snode_start;
	/* Search for a new leaf */
	while ( descendants[j] != 0 && j < n ) j++;
    }
}